

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.H
# Opt level: O1

int navkey(void)

{
  if ((Fl::e_state & 0x4c0000U) == 0) {
    if (Fl::e_keysym - 0xff51U < 4) {
      return Fl::e_keysym;
    }
    if (Fl::e_keysym == 0xff09) {
      return (uint)(((uint)Fl::e_state >> 0x10 & 1) == 0) * 2 + 0xff51;
    }
  }
  return 0;
}

Assistant:

static int event_state(int mask) {return e_state&mask;}